

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_log_read_header(hdr_log_reader *reader,FILE *file)

{
  bool bVar1;
  _Bool _Var2;
  int __c;
  char *pcVar3;
  int c;
  _Bool parsing_header;
  char line [128];
  FILE *file_local;
  hdr_log_reader *reader_local;
  
  bVar1 = true;
  do {
    __c = fgetc((FILE *)file);
    ungetc(__c,(FILE *)file);
    if (__c == 0x22) {
      pcVar3 = fgets((char *)&c,0x80,(FILE *)file);
      if (pcVar3 == (char *)0x0) {
        return 5;
      }
      bVar1 = false;
    }
    else if (__c == 0x23) {
      pcVar3 = fgets((char *)&c,0x80,(FILE *)file);
      if (pcVar3 == (char *)0x0) {
        return 5;
      }
      scan_header_line(reader,(char *)&c);
    }
    else {
      bVar1 = false;
    }
  } while (bVar1);
  _Var2 = validate_log_version(reader);
  if (_Var2) {
    reader_local._4_4_ = 0;
  }
  else {
    reader_local._4_4_ = -0x7529;
  }
  return reader_local._4_4_;
}

Assistant:

int hdr_log_read_header(struct hdr_log_reader* reader, FILE* file)
{
    char line[HEADER_LINE_LENGTH]; /* TODO: check for overflow. */

    bool parsing_header = true;

    do
    {
        int c = fgetc(file);
        ungetc(c, file);

        switch (c)
        {

        case '#':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            scan_header_line(reader, line);
            break;

        case '"':
            if (fgets(line, HEADER_LINE_LENGTH, file) == NULL)
            {
                return EIO;
            }

            parsing_header = false;
            break;

        default:
            parsing_header = false;
        }
    }
    while (parsing_header);

    if (!validate_log_version(reader))
    {
        return HDR_LOG_INVALID_VERSION;
    }

    return 0;
}